

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_state_callback_add(callback_type_e c_type,_func_void_void_ptr *func,void *arg)

{
  fio_ls_embd_s *pfVar1;
  ulong uVar2;
  fio_ls_embd_s *pfVar3;
  int *piVar4;
  fio_lock_i ret;
  
  if ((c_type == FIO_CALL_ON_INITIALIZE) && (fio_data != (fio_data_s *)0x0)) {
    (*func)(arg);
    return;
  }
  if (c_type < (FIO_CALL_AT_EXIT|FIO_CALL_BEFORE_FORK) && func != (_func_void_void_ptr *)0x0) {
    uVar2 = (ulong)c_type;
    fio_lock(&callback_collection[uVar2].lock);
    if (callback_collection[uVar2].callbacks.next == (fio_ls_embd_s *)0x0) {
      pfVar3 = (fio_ls_embd_s *)(uVar2 * 0x18 + 0x17f9e8);
      callback_collection[uVar2].callbacks.prev = pfVar3;
      callback_collection[uVar2].callbacks.next = pfVar3;
    }
    pfVar3 = (fio_ls_embd_s *)malloc(0x20);
    if (pfVar3 == (fio_ls_embd_s *)0x0) {
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:3334"
                      );
      }
      kill(0,2);
      piVar4 = __errno_location();
      exit(*piVar4);
    }
    pfVar3[1].prev = (fio_ls_embd_s *)func;
    pfVar3[1].next = (fio_ls_embd_s *)arg;
    pfVar1 = callback_collection[uVar2].callbacks.prev;
    pfVar3->prev = pfVar1;
    pfVar3->next = (fio_ls_embd_s *)(uVar2 * 0x18 + 0x17f9e8);
    pfVar1->next = pfVar3;
    callback_collection[uVar2].callbacks.prev = pfVar3;
    LOCK();
    callback_collection[uVar2].lock = '\0';
    UNLOCK();
  }
  return;
}

Assistant:

void fio_state_callback_add(callback_type_e c_type, void (*func)(void *),
                            void *arg) {
  if (c_type == FIO_CALL_ON_INITIALIZE && fio_data) {
    func(arg);
    return;
  }
  if (!func || (int)c_type < 0 || c_type > FIO_CALL_NEVER)
    return;
  fio_lock(&callback_collection[c_type].lock);
  fio_state_callback_ensure(&callback_collection[c_type]);
  callback_data_s *tmp = malloc(sizeof(*tmp));
  FIO_ASSERT_ALLOC(tmp);
  *tmp = (callback_data_s){.func = func, .arg = arg};
  fio_ls_embd_push(&callback_collection[c_type].callbacks, &tmp->node);
  fio_unlock(&callback_collection[c_type].lock);
}